

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::checkTimeStep(PeleLM *this,Real a_time,Real a_dt)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Real RVar11;
  Real RVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  double *pdVar17;
  Long LVar18;
  Long LVar19;
  Long LVar20;
  int iVar21;
  double *pdVar22;
  Long LVar23;
  Long LVar24;
  int iVar25;
  double *pdVar26;
  Long LVar27;
  Long LVar28;
  int iVar29;
  int iVar30;
  double *pdVar31;
  Long LVar32;
  Long LVar33;
  double *pdVar34;
  Long LVar35;
  Long LVar36;
  int iVar37;
  double *pdVar38;
  Long LVar39;
  Long LVar40;
  double *pdVar41;
  Long LVar42;
  Long LVar43;
  int iVar44;
  int iVar45;
  uint uVar46;
  uint uVar47;
  int iVar48;
  uint uVar49;
  FabArray<amrex::FArrayBox> *this_00;
  FabArray<amrex::FArrayBox> *this_01;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  uint uVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  uint uVar76;
  long lVar77;
  uint uVar78;
  uint uVar79;
  char *__format;
  int iVar80;
  int iVar81;
  long lVar82;
  uint uVar83;
  long lVar84;
  double dVar85;
  double dVar86;
  Box local_26c;
  Array4<const_double> local_250;
  Array4<const_double> local_210;
  Array4<const_double> local_1d0;
  Array4<const_double> local_190;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter mfi;
  
  if ((NavierStokesBase::fixed_dt <= 0.0) && (divu_ceiling != 0)) {
    this_00 = &amrex::AmrLevel::get_data((AmrLevel *)this,NavierStokesBase::Divu_Type,a_time)->
               super_FabArray<amrex::FArrayBox>;
    this_01 = &amrex::AmrLevel::get_data((AmrLevel *)this,0,a_time)->
               super_FabArray<amrex::FArrayBox>;
    amrex::MFIter::MFIter(&mfi,&this_01->super_FabArrayBase,true);
    while (mfi.currentIndex < mfi.endIndex) {
      amrex::MFIter::tilebox(&local_26c,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,
                 &(this->super_NavierStokesBase).rho_ctime.super_FabArray<amrex::FArrayBox>,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_250,this_01,&mfi,0)
      ;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_110,this_00,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_150,&(this->super_NavierStokesBase).volume.super_FabArray<amrex::FArrayBox>,
                 &mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_190,
                 (FabArray<amrex::FArrayBox> *)&(this->super_NavierStokesBase).field_0x540,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_1d0,
                 (FabArray<amrex::FArrayBox> *)&(this->super_NavierStokesBase).field_0x6c0,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_210,
                 (FabArray<amrex::FArrayBox> *)&(this->super_NavierStokesBase).field_0x840,&mfi);
      iVar45 = local_d0.begin.z;
      iVar44 = local_d0.begin.y;
      LVar43 = local_d0.kstride;
      LVar42 = local_d0.jstride;
      pdVar41 = local_d0.p;
      LVar40 = local_110.kstride;
      LVar39 = local_110.jstride;
      pdVar38 = local_110.p;
      iVar37 = local_150.begin.x;
      LVar36 = local_150.kstride;
      LVar35 = local_150.jstride;
      pdVar34 = local_150.p;
      LVar33 = local_190.kstride;
      LVar32 = local_190.jstride;
      pdVar31 = local_190.p;
      iVar30 = local_1d0.begin.y;
      iVar29 = local_1d0.begin.x;
      LVar28 = local_1d0.kstride;
      LVar27 = local_1d0.jstride;
      pdVar26 = local_1d0.p;
      iVar25 = local_210.begin.x;
      LVar24 = local_210.kstride;
      LVar23 = local_210.jstride;
      pdVar22 = local_210.p;
      iVar21 = local_250.begin.y;
      LVar20 = local_250.nstride;
      LVar19 = local_250.kstride;
      LVar18 = local_250.jstride;
      pdVar17 = local_250.p;
      iVar16 = local_26c.bigend.vect[1];
      iVar15 = local_26c.bigend.vect[0];
      iVar14 = local_26c.smallend.vect[1];
      iVar13 = local_26c.smallend.vect[0];
      RVar12 = min_rho_divu_ceiling;
      RVar11 = divu_dt_factor;
      iVar10 = divu_ceiling;
      dVar4 = (this->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.inv_dx[0];
      dVar5 = (this->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.inv_dx[1];
      dVar6 = (this->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.inv_dx[2];
      lVar55 = (long)local_d0.begin.z;
      uVar79 = ~local_d0.begin.x;
      uVar47 = ~local_d0.begin.y;
      iVar8 = -local_110.begin.x;
      uVar54 = ~local_d0.begin.z;
      iVar48 = -local_250.begin.x;
      iVar9 = -local_190.begin.x;
      iVar81 = -local_d0.begin.x;
      uVar78 = ~local_250.begin.x;
      lVar56 = (long)local_250.begin.z;
      lVar57 = (long)local_110.begin.y;
      lVar58 = (long)local_110.begin.z;
      lVar59 = (long)local_150.begin.y;
      lVar60 = (long)local_150.begin.z;
      lVar61 = (long)local_190.begin.y;
      lVar62 = (long)local_190.begin.z;
      lVar63 = (long)local_1d0.begin.z;
      lVar64 = (long)local_210.begin.y;
      lVar65 = (long)local_210.begin.z;
      lVar66 = (long)local_26c.bigend.vect[2];
      uVar49 = local_26c.bigend.vect[0] + 1;
      lVar51 = (long)local_26c.smallend.vect[2];
      while (lVar51 <= lVar66) {
        lVar1 = lVar51 + -1;
        lVar2 = lVar51 + 1;
        lVar82 = (lVar51 - lVar55) * LVar43;
        lVar84 = (lVar51 - lVar56) * LVar19;
        lVar50 = (lVar51 - lVar62) * LVar33;
        lVar67 = (lVar51 - lVar63) * LVar28;
        lVar77 = lVar51 - lVar65;
        lVar68 = lVar51 - lVar60;
        lVar69 = (lVar51 - lVar58) * LVar40;
        iVar80 = (int)lVar51;
        uVar46 = iVar14;
        while (uVar83 = uVar46, lVar51 = lVar2, (int)uVar83 <= iVar16) {
          if (iVar15 < iVar13) {
            uVar46 = uVar83 + 1;
          }
          else {
            uVar46 = uVar83 + 1;
            lVar51 = (int)(uVar83 - iVar44) * LVar42;
            lVar52 = (int)(uVar83 - iVar21) * LVar18;
            lVar70 = (int)(uVar46 - iVar44) * LVar42;
            lVar71 = (long)(int)uVar83;
            lVar74 = (lVar71 - lVar61) * LVar32;
            lVar75 = (lVar71 - lVar64) * LVar23;
            lVar72 = (lVar71 - lVar57) * LVar39;
            uVar76 = iVar13;
            do {
              lVar73 = (long)(int)(iVar81 + uVar76);
              dVar7 = pdVar41[lVar51 + lVar73 + lVar82];
              if (iVar10 == 3) {
                lVar53 = (long)(int)(iVar48 + uVar76);
                pdVar3 = pdVar17 + lVar52 + lVar53 + lVar84;
                dVar86 = (((pdVar3[LVar20 * 2] +
                           pdVar17[lVar52 + lVar53 + (lVar2 - lVar56) * LVar19 + LVar20 * 2]) *
                           (pdVar41[lVar51 + lVar73 + (lVar2 - lVar55) * LVar43] + dVar7) * 0.25 *
                           pdVar22[lVar75 + (long)(int)(uVar76 - iVar25) + (lVar2 - lVar65) * LVar24
                                  ] +
                          (((pdVar3[LVar20] +
                            pdVar17[LVar20 + lVar84 + (int)(uVar46 - iVar21) * LVar18 + lVar53]) *
                            (pdVar41[lVar82 + lVar70 + lVar73] + dVar7) * 0.25 *
                            pdVar26[lVar67 + (int)(uVar46 - iVar30) * LVar27 +
                                             (long)(int)(uVar76 - iVar29)] +
                           ((*pdVar3 + pdVar17[lVar52 + lVar84 + (int)(iVar48 + 1 + uVar76)]) *
                            (pdVar41[lVar51 + lVar82 + (int)(iVar81 + 1 + uVar76)] + dVar7) * 0.25 *
                            pdVar31[lVar50 + lVar74 + (int)(iVar9 + 1 + uVar76)] -
                           (pdVar17[lVar52 + lVar84 + (int)(uVar78 + uVar76)] + *pdVar3) *
                           (pdVar41[lVar51 + lVar82 + (int)(uVar79 + uVar76)] + dVar7) * 0.25 *
                           pdVar31[lVar50 + lVar74 + (int)(iVar9 + uVar76)])) -
                          (pdVar17[LVar20 + lVar84 + (int)((uVar83 - 1) - iVar21) * LVar18 + lVar53]
                          + pdVar3[LVar20]) *
                          (pdVar41[lVar82 + (int)((uVar83 - 1) - iVar44) * LVar42 + lVar73] + dVar7)
                          * 0.25 * pdVar26[lVar67 + (int)(uVar83 - iVar30) * LVar27 +
                                                    (long)(int)(uVar76 - iVar29)])) -
                         (pdVar17[lVar52 + lVar53 + (lVar1 - lVar56) * LVar19 + LVar20 * 2] +
                         pdVar3[LVar20 * 2]) *
                         (pdVar41[lVar51 + lVar73 + (lVar1 - lVar55) * LVar43] + dVar7) * 0.25 *
                         pdVar22[lVar75 + (long)(int)(uVar76 - iVar25) + lVar77 * LVar24]) /
                         pdVar34[lVar68 * LVar36 +
                                 (lVar71 - lVar59) * LVar35 + (long)(int)(uVar76 - iVar37)];
LAB_001867fd:
                dVar85 = 1000000000000.0;
                if (0.0 < dVar86) {
                  dVar85 = (double)(~-(ulong)(RVar12 < dVar7) & (ulong)ABS(dVar7) |
                                   (ulong)(dVar7 - RVar12) & -(ulong)(RVar12 < dVar7));
LAB_0018683a:
                  dVar85 = dVar85 / dVar86;
                }
              }
              else {
                if (iVar10 == 2) {
                  lVar53 = (long)(int)(iVar48 + uVar76);
                  dVar86 = (pdVar41[lVar51 + lVar73 + ((int)lVar2 - iVar45) * LVar43] -
                           pdVar41[lVar51 + lVar73 + (int)(uVar54 + iVar80) * LVar43]) *
                           pdVar17[lVar84 + lVar52 + lVar53 + LVar20 * 2] * dVar6 +
                           (pdVar41[lVar82 + lVar70 + lVar73] -
                           pdVar41[lVar82 + (int)(uVar47 + uVar83) * LVar42 + lVar73]) *
                           pdVar17[lVar84 + lVar52 + lVar53 + LVar20] * dVar5 +
                           pdVar38[lVar69 + lVar72 + (int)(iVar8 + uVar76)] * dVar7 +
                           (pdVar41[lVar51 + lVar82 + (int)(iVar81 + uVar76 + 1)] -
                           pdVar41[lVar51 + lVar82 + (int)(uVar79 + uVar76)]) *
                           pdVar17[lVar84 + lVar52 + lVar53] * dVar4;
                  goto LAB_001867fd;
                }
                dVar85 = 1000000000000.0;
                if (iVar10 == 1) {
                  dVar86 = pdVar38[lVar69 + lVar72 + (int)(iVar8 + uVar76)];
                  dVar85 = 1000000000000.0;
                  if (dVar86 <= 0.0) goto LAB_0018683e;
                  if (dVar7 <= RVar12) {
                    dVar85 = 1.0;
                  }
                  else {
                    dVar85 = 1.0 - RVar12 / dVar7;
                  }
                  goto LAB_0018683a;
                }
              }
LAB_0018683e:
              if (a_dt <= dVar85) {
                if (dVar85 * RVar11 < a_dt) {
                  __format = " WARNING: check_divu_dt - [%i,%i,%i] dtcell*dtfactor %f8.6 > dt %f8.6"
                  ;
                  goto LAB_00186863;
                }
              }
              else {
                __format = " ERROR: check_divu_dt - [%i,%i,%i] dtcell %f8.6 > dt %f8.6";
LAB_00186863:
                printf(__format,(ulong)uVar76,(ulong)uVar83);
              }
              uVar76 = uVar76 + 1;
            } while (uVar49 != uVar76);
          }
        }
      }
      amrex::MFIter::operator++(&mfi);
    }
    amrex::MFIter::~MFIter(&mfi);
  }
  return;
}

Assistant:

void
PeleLM::checkTimeStep (const Real a_time,
                       Real a_dt)
{
   BL_PROFILE("PLM::checkTimeStep()");

   if (fixed_dt > 0.0 || !divu_ceiling) {
      return;
   }

   // Get class state data refs. We assume it's been FillPatched already !
   const MultiFab& divU = get_data(Divu_Type,a_time);
   const MultiFab& S    = get_data(State_Type,a_time);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S,TilingIfNotGPU()); mfi.isValid();++mfi)
   {
      const Box&  bx   = mfi.tilebox();
      auto const& rho  = rho_ctime.const_array(mfi);
      auto const& vel  = S.const_array(mfi,0);
      auto const& divu = divU.const_array(mfi);
      auto const& vol  = volume.const_array(mfi);
      AMREX_D_TERM(auto const& areax = (area[0]).const_array(mfi);,
                   auto const& areay = (area[1]).const_array(mfi);,
                   auto const& areaz = (area[2]).const_array(mfi););
      int  divu_check_flag = divu_ceiling;
      Real divu_dt_fac     = divu_dt_factor;
      Real rho_min         = min_rho_divu_ceiling;
      const auto dxinv     = geom.InvCellSizeArray();

      amrex::ParallelFor(bx, [rho, vel, divu, vol, AMREX_D_DECL(areax,areay,areaz),
                              divu_check_flag, divu_dt_fac, rho_min, dxinv, a_dt]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
         check_divu_dt(i, j, k, divu_check_flag, divu_dt_fac, rho_min, dxinv,
                       rho, vel, divu, vol, AMREX_D_DECL(areax,areay,areaz), a_dt);
      });
   }
}